

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::LSTM_x86_avx512::forward(LSTM_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__src;
  void *__dest;
  Mat *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar4;
  float *ptr_4;
  float *pr;
  float *pf;
  int i_4;
  int ret_2;
  int ret_1;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat cell;
  Mat hidden;
  int num_directions;
  int T;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *in_stack_ffffffffffffec18;
  Mat *in_stack_ffffffffffffec20;
  int in_stack_ffffffffffffec28;
  int in_stack_ffffffffffffec2c;
  Mat *in_stack_ffffffffffffec30;
  Mat *pMVar5;
  int local_1094;
  void *local_1090;
  int *local_1088;
  ulong local_1080;
  undefined4 local_1078;
  long *local_1070;
  int local_1068;
  int local_1064;
  int local_1060;
  undefined4 local_105c;
  undefined4 local_1058;
  ulong local_1050;
  void *local_1048;
  int *local_1040;
  ulong local_1038;
  undefined4 local_1030;
  long *local_1028;
  int local_1020;
  int local_101c;
  int local_1018;
  undefined4 local_1014;
  undefined4 local_1010;
  ulong local_1008;
  void *local_1000;
  int *local_ff8;
  ulong local_ff0;
  undefined4 local_fe8;
  long *local_fe0;
  int local_fd8;
  int local_fd4;
  int local_fd0;
  undefined4 local_fcc;
  undefined4 local_fc8;
  ulong local_fc0;
  void *local_fb8;
  int *local_fb0;
  ulong local_fa8;
  undefined4 local_fa0;
  long *local_f98;
  int local_f90;
  int local_f8c;
  int local_f88;
  undefined4 local_f84;
  undefined4 local_f80;
  ulong local_f78;
  int local_f6c;
  void *local_f68;
  int *local_f60;
  ulong local_f58;
  undefined4 local_f50;
  long *local_f48;
  int local_f40;
  int local_f3c;
  int local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  ulong local_f28;
  void *local_f20;
  int *local_f18;
  ulong local_f10;
  undefined4 local_f08;
  long *local_f00;
  int local_ef8;
  int local_ef4;
  int local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  ulong local_ee0;
  void *local_ed8;
  int *local_ed0;
  ulong local_ec8;
  undefined4 local_ec0;
  long *local_eb8;
  int local_eb0;
  int local_eac;
  int local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  ulong local_e98;
  void *local_e90;
  int *local_e88;
  ulong local_e80;
  undefined4 local_e78;
  long *local_e70;
  int local_e68;
  int local_e64;
  int local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  ulong local_e50;
  int local_e44;
  void *local_e40;
  int *local_e38;
  long local_e30;
  undefined4 local_e28;
  long *local_e20;
  undefined4 local_e18;
  int local_e14;
  undefined4 local_e10;
  undefined4 local_e0c;
  int local_e08;
  long local_e00;
  void *local_df8;
  int *local_df0;
  long local_de8;
  undefined4 local_de0;
  long *local_dd8;
  undefined4 local_dd0;
  int local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  int local_dc0;
  long local_db8;
  void *local_db0;
  int *local_da8;
  ulong local_da0;
  undefined4 local_d98;
  long *local_d90;
  int local_d88;
  int local_d84;
  int local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  ulong local_d70;
  void *local_d68;
  int *local_d60;
  ulong local_d58;
  undefined4 local_d50;
  long *local_d48;
  int local_d40;
  int local_d3c;
  int local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  ulong local_d28;
  void *local_d20;
  int *local_d18;
  ulong local_d10;
  undefined4 local_d08;
  long *local_d00;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  ulong local_ce0;
  void *local_cd8;
  int *local_cd0;
  ulong local_cc8;
  undefined4 local_cc0;
  long *local_cb8;
  int local_cb0;
  int local_cac;
  int local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  ulong local_c98;
  int local_c8c;
  Mat local_c88;
  int local_c40;
  Mat local_c30;
  undefined4 local_be8;
  int local_be4;
  Mat *local_be0;
  long *local_bd8;
  int local_bbc;
  void **local_bb8;
  void **local_bb0;
  void **local_ba8;
  void **local_ba0;
  void **local_b90;
  void **local_b80;
  void **local_b70;
  void **local_b60;
  void **local_b50;
  void **local_b40;
  void **local_b30;
  Option *in_stack_fffffffffffff4d8;
  Mat *in_stack_fffffffffffff4e0;
  Mat *in_stack_fffffffffffff4e8;
  LSTM_x86_avx512 *in_stack_fffffffffffff4f0;
  int local_804;
  undefined4 *local_800;
  int local_7e4;
  undefined4 *local_7e0;
  int local_7c4;
  undefined4 *local_7c0;
  int local_7a4;
  undefined4 *local_7a0;
  Mat *in_stack_fffffffffffffe78;
  Mat *in_stack_fffffffffffffe80;
  Mat *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  Mat *in_stack_fffffffffffffe98;
  Mat *in_stack_fffffffffffffea0;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  if (*(int *)(in_RDI + 0xe0) != 0) {
    iVar2 = forward_int8(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8,
                         in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
    return iVar2;
  }
  local_be4 = *(int *)(in_RSI + 0x30);
  local_be8 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_be8 = 2;
  }
  local_c30.data = (undefined4 *)0x0;
  local_c30.refcount = (int *)0x0;
  local_c30.elemsize = 0;
  local_c30.elempack = 0;
  local_c30.allocator = (Allocator *)0x0;
  local_c30.dims = 0;
  local_c30.w = 0;
  local_c30.h = 0;
  local_c30.d = 0;
  local_c30.c = 0;
  local_c30.cstep = 0;
  local_be0 = in_RCX;
  local_bd8 = in_RDX;
  Mat::create(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c,(size_t)in_stack_ffffffffffffec20,
              (Allocator *)in_stack_ffffffffffffec18);
  if ((undefined4 *)local_c30.data == (undefined4 *)0x0 || local_c30.cstep * (long)local_c30.c == 0)
  {
    local_bbc = -100;
    local_c40 = 1;
    goto LAB_010c0e66;
  }
  local_7a0 = (undefined4 *)local_c30.data;
  for (local_7a4 = 0; local_7a4 < (int)local_c30.cstep * local_c30.c; local_7a4 = local_7a4 + 1) {
    *local_7a0 = 0;
    local_7a0 = local_7a0 + 1;
  }
  local_c88.data = (undefined4 *)0x0;
  local_c88.refcount = (int *)0x0;
  local_c88.elemsize = 0;
  local_c88.elempack = 0;
  local_c88.allocator = (Allocator *)0x0;
  local_c88.dims = 0;
  local_c88.w = 0;
  local_c88.h = 0;
  local_c88.d = 0;
  local_c88.c = 0;
  local_c88.cstep = 0;
  Mat::create(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c,(size_t)in_stack_ffffffffffffec20,
              (Allocator *)in_stack_ffffffffffffec18);
  if ((undefined4 *)local_c88.data == (undefined4 *)0x0 || local_c88.cstep * (long)local_c88.c == 0)
  {
    local_bbc = -100;
    local_c40 = 1;
  }
  else {
    local_7c0 = (undefined4 *)local_c88.data;
    for (local_7c4 = 0; local_7c4 < (int)local_c88.cstep * local_c88.c; local_7c4 = local_7c4 + 1) {
      *local_7c0 = 0;
      local_7c0 = local_7c0 + 1;
    }
    Mat::create(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28,
                (size_t)in_stack_ffffffffffffec20,(Allocator *)in_stack_ffffffffffffec18);
    bVar4 = true;
    if (*local_bd8 != 0) {
      bVar4 = local_bd8[8] * (long)(int)local_bd8[7] == 0;
    }
    if (bVar4) {
      local_bbc = -100;
      local_c40 = 1;
    }
    else {
      if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
        local_cac = *(int *)(in_RDI + 0x2c4);
        local_ca8 = *(int *)(in_RDI + 0x2c8);
        local_ca0 = *(undefined4 *)(in_RDI + 0x2cc);
        local_cd8 = *(void **)(in_RDI + 0x298);
        local_cc8 = *(ulong *)(in_RDI + 0x2a8);
        local_cc0 = *(undefined4 *)(in_RDI + 0x2b0);
        local_cb8 = *(long **)(in_RDI + 0x2b8);
        local_cd0 = (int *)0x0;
        local_ca4 = 1;
        local_c98 = ((long)local_cac * (long)local_ca8 * local_cc8 + 0xf & 0xfffffffffffffff0) /
                    local_cc8;
        local_cb0 = *(int *)(in_RDI + 0x2c0) + -1;
        if (*(int *)(in_RDI + 0x2c0) == 4) {
          local_c98 = (long)*(int *)(in_RDI + 0x2c4) * (long)*(int *)(in_RDI + 0x2c8);
        }
        local_cf4 = *(int *)(in_RDI + 0x30c);
        local_cf0 = *(int *)(in_RDI + 0x310);
        local_ce8 = *(undefined4 *)(in_RDI + 0x314);
        local_d20 = *(void **)(in_RDI + 0x2e0);
        local_d10 = *(ulong *)(in_RDI + 0x2f0);
        local_d08 = *(undefined4 *)(in_RDI + 0x2f8);
        local_d00 = *(long **)(in_RDI + 0x300);
        local_d18 = (int *)0x0;
        local_cec = 1;
        local_ce0 = ((long)local_cf4 * (long)local_cf0 * local_d10 + 0xf & 0xfffffffffffffff0) /
                    local_d10;
        local_cf8 = *(int *)(in_RDI + 0x308) + -1;
        if (*(int *)(in_RDI + 0x308) == 4) {
          local_ce0 = (long)*(int *)(in_RDI + 0x30c) * (long)*(int *)(in_RDI + 0x310);
        }
        local_d3c = *(int *)(in_RDI + 0x354);
        local_d38 = *(int *)(in_RDI + 0x358);
        local_d30 = *(undefined4 *)(in_RDI + 0x35c);
        local_d68 = *(void **)(in_RDI + 0x328);
        local_d58 = *(ulong *)(in_RDI + 0x338);
        local_d50 = *(undefined4 *)(in_RDI + 0x340);
        local_d48 = *(long **)(in_RDI + 0x348);
        local_d60 = (int *)0x0;
        local_d34 = 1;
        local_d28 = ((long)local_d3c * (long)local_d38 * local_d58 + 0xf & 0xfffffffffffffff0) /
                    local_d58;
        local_d40 = *(int *)(in_RDI + 0x350) + -1;
        if (*(int *)(in_RDI + 0x350) == 4) {
          local_d28 = (long)*(int *)(in_RDI + 0x354) * (long)*(int *)(in_RDI + 0x358);
        }
        if (*(int *)(in_RDI + 0xd0) == *(int *)(in_RDI + 0xdc)) {
          local_bb8 = &local_db0;
          local_db0 = (void *)0x0;
          local_da0 = 0;
          local_d98 = 0;
          local_d90 = (long *)0x0;
          local_d88 = 0;
          local_d84 = 0;
          local_d80 = 0;
          local_d7c = 0;
          local_d78 = 0;
          local_d70 = 0;
        }
        else {
          local_d84 = *(int *)(in_RDI + 0x1ec);
          local_d80 = *(int *)(in_RDI + 0x1f0);
          local_d78 = *(undefined4 *)(in_RDI + 500);
          local_db0 = *(void **)(in_RDI + 0x1c0);
          local_da0 = *(ulong *)(in_RDI + 0x1d0);
          local_d98 = *(undefined4 *)(in_RDI + 0x1d8);
          local_d90 = *(long **)(in_RDI + 0x1e0);
          local_d7c = 1;
          local_d70 = ((long)local_d84 * (long)local_d80 * local_da0 + 0xf & 0xfffffffffffffff0) /
                      local_da0;
          local_d88 = *(int *)(in_RDI + 0x1e8) + -1;
          if (*(int *)(in_RDI + 0x1e8) == 4) {
            local_d70 = (long)*(int *)(in_RDI + 0x1ec) * (long)*(int *)(in_RDI + 0x1f0);
          }
        }
        local_da8 = (int *)0x0;
        in_stack_ffffffffffffec18 = &local_c88;
        in_stack_ffffffffffffec20 = local_be0;
        iVar3 = lstm(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,iVar2,
                     in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     &local_c30,in_stack_ffffffffffffec18,local_be0,
                     (Option *)CONCAT44(in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28));
        local_ba0 = &local_db0;
        if (local_da8 != (int *)0x0) {
          LOCK();
          iVar1 = *local_da8;
          *local_da8 = *local_da8 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_d90 == (long *)0x0) {
              if (local_db0 != (void *)0x0) {
                free(local_db0);
              }
            }
            else {
              (**(code **)(*local_d90 + 0x18))(local_d90,local_db0);
            }
          }
        }
        local_db0 = (void *)0x0;
        local_da0 = 0;
        local_d98 = 0;
        local_d88 = 0;
        local_d84 = 0;
        local_d80 = 0;
        local_d7c = 0;
        local_d78 = 0;
        local_d70 = 0;
        local_da8 = (int *)0x0;
        local_b90 = &local_d68;
        if (local_d60 != (int *)0x0) {
          LOCK();
          iVar1 = *local_d60;
          *local_d60 = *local_d60 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_d48 == (long *)0x0) {
              if (local_d68 != (void *)0x0) {
                free(local_d68);
              }
            }
            else {
              (**(code **)(*local_d48 + 0x18))(local_d48,local_d68);
            }
          }
        }
        local_d68 = (void *)0x0;
        local_d58 = 0;
        local_d50 = 0;
        local_d40 = 0;
        local_d3c = 0;
        local_d38 = 0;
        local_d34 = 0;
        local_d30 = 0;
        local_d28 = 0;
        local_d60 = (int *)0x0;
        local_b80 = &local_d20;
        if (local_d18 != (int *)0x0) {
          LOCK();
          iVar1 = *local_d18;
          *local_d18 = *local_d18 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_d00 == (long *)0x0) {
              if (local_d20 != (void *)0x0) {
                free(local_d20);
              }
            }
            else {
              (**(code **)(*local_d00 + 0x18))(local_d00,local_d20);
            }
          }
        }
        local_d20 = (void *)0x0;
        local_d10 = 0;
        local_d08 = 0;
        local_cf8 = 0;
        local_cf4 = 0;
        local_cf0 = 0;
        local_cec = 0;
        local_ce8 = 0;
        local_ce0 = 0;
        local_d18 = (int *)0x0;
        local_b70 = &local_cd8;
        if (local_cd0 != (int *)0x0) {
          LOCK();
          iVar1 = *local_cd0;
          *local_cd0 = *local_cd0 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_cb8 == (long *)0x0) {
              if (local_cd8 != (void *)0x0) {
                free(local_cd8);
              }
            }
            else {
              (**(code **)(*local_cb8 + 0x18))(local_cb8,local_cd8);
            }
          }
        }
        local_cd8 = (void *)0x0;
        local_cc8 = 0;
        local_cc0 = 0;
        local_cb0 = 0;
        local_cac = 0;
        local_ca8 = 0;
        local_ca4 = 0;
        local_ca0 = 0;
        local_c98 = 0;
        local_cd0 = (int *)0x0;
        local_c8c = iVar3;
        if (iVar3 != 0) {
          local_c40 = 1;
          local_bbc = iVar3;
          goto LAB_010c0c3a;
        }
      }
      if (*(int *)(in_RDI + 0xd8) == 2) {
        local_df8 = (void *)0x0;
        local_df0 = (int *)0x0;
        local_de8 = 0;
        local_de0 = 0;
        local_dd8 = (long *)0x0;
        local_dd0 = 0;
        local_dcc = 0;
        local_dc8 = 0;
        local_dc4 = 0;
        local_dc0 = 0;
        local_db8 = 0;
        Mat::create(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28,
                    (size_t)in_stack_ffffffffffffec20,(Allocator *)in_stack_ffffffffffffec18);
        if (local_df8 == (void *)0x0 || local_db8 * local_dc0 == 0) {
          local_bbc = -100;
          local_c40 = 1;
        }
        else {
          local_e40 = (void *)0x0;
          local_e38 = (int *)0x0;
          local_e30 = 0;
          local_e28 = 0;
          local_e20 = (long *)0x0;
          local_e18 = 0;
          local_e14 = 0;
          local_e10 = 0;
          local_e0c = 0;
          local_e08 = 0;
          local_e00 = 0;
          Mat::create(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28,
                      (size_t)in_stack_ffffffffffffec20,(Allocator *)in_stack_ffffffffffffec18);
          if (local_e40 == (void *)0x0 || local_e00 * local_e08 == 0) {
            local_bbc = -100;
            local_c40 = 1;
          }
          else {
            local_e64 = *(int *)(in_RDI + 0x2c4);
            local_e60 = *(int *)(in_RDI + 0x2c8);
            local_e58 = *(undefined4 *)(in_RDI + 0x2cc);
            local_e90 = *(void **)(in_RDI + 0x298);
            local_e80 = *(ulong *)(in_RDI + 0x2a8);
            local_e78 = *(undefined4 *)(in_RDI + 0x2b0);
            local_e70 = *(long **)(in_RDI + 0x2b8);
            local_e88 = (int *)0x0;
            local_e5c = 1;
            local_e50 = ((long)local_e64 * (long)local_e60 * local_e80 + 0xf & 0xfffffffffffffff0) /
                        local_e80;
            local_e68 = *(int *)(in_RDI + 0x2c0) + -1;
            if (*(int *)(in_RDI + 0x2c0) == 4) {
              local_e50 = (long)*(int *)(in_RDI + 0x2c4) * (long)*(int *)(in_RDI + 0x2c8);
            }
            local_eac = *(int *)(in_RDI + 0x30c);
            local_ea8 = *(int *)(in_RDI + 0x310);
            local_ea0 = *(undefined4 *)(in_RDI + 0x314);
            local_ed8 = *(void **)(in_RDI + 0x2e0);
            local_ec8 = *(ulong *)(in_RDI + 0x2f0);
            local_ec0 = *(undefined4 *)(in_RDI + 0x2f8);
            local_eb8 = *(long **)(in_RDI + 0x300);
            local_ed0 = (int *)0x0;
            local_ea4 = 1;
            local_e98 = ((long)local_eac * (long)local_ea8 * local_ec8 + 0xf & 0xfffffffffffffff0) /
                        local_ec8;
            local_eb0 = *(int *)(in_RDI + 0x308) + -1;
            if (*(int *)(in_RDI + 0x308) == 4) {
              local_e98 = (long)*(int *)(in_RDI + 0x30c) * (long)*(int *)(in_RDI + 0x310);
            }
            local_ef4 = *(int *)(in_RDI + 0x354);
            local_ef0 = *(int *)(in_RDI + 0x358);
            local_ee8 = *(undefined4 *)(in_RDI + 0x35c);
            local_f20 = *(void **)(in_RDI + 0x328);
            local_f10 = *(ulong *)(in_RDI + 0x338);
            local_f08 = *(undefined4 *)(in_RDI + 0x340);
            local_f00 = *(long **)(in_RDI + 0x348);
            local_f18 = (int *)0x0;
            local_eec = 1;
            local_ee0 = ((long)local_ef4 * (long)local_ef0 * local_f10 + 0xf & 0xfffffffffffffff0) /
                        local_f10;
            local_ef8 = *(int *)(in_RDI + 0x350) + -1;
            if (*(int *)(in_RDI + 0x350) == 4) {
              local_ee0 = (long)*(int *)(in_RDI + 0x354) * (long)*(int *)(in_RDI + 0x358);
            }
            if (*(int *)(in_RDI + 0xd0) == *(int *)(in_RDI + 0xdc)) {
              local_bb0 = &local_f68;
              local_f68 = (void *)0x0;
              local_f58 = 0;
              local_f50 = 0;
              local_f48 = (long *)0x0;
              local_f40 = 0;
              local_f3c = 0;
              local_f38 = 0;
              local_f34 = 0;
              local_f30 = 0;
              local_f28 = 0;
            }
            else {
              local_f3c = *(int *)(in_RDI + 0x1ec);
              local_f38 = *(int *)(in_RDI + 0x1f0);
              local_f30 = *(undefined4 *)(in_RDI + 500);
              local_f68 = *(void **)(in_RDI + 0x1c0);
              local_f58 = *(ulong *)(in_RDI + 0x1d0);
              local_f50 = *(undefined4 *)(in_RDI + 0x1d8);
              local_f48 = *(long **)(in_RDI + 0x1e0);
              local_f34 = 1;
              local_f28 = ((long)local_f3c * (long)local_f38 * local_f58 + 0xf & 0xfffffffffffffff0)
                          / local_f58;
              local_f40 = *(int *)(in_RDI + 0x1e8) + -1;
              if (*(int *)(in_RDI + 0x1e8) == 4) {
                local_f28 = (long)*(int *)(in_RDI + 0x1ec) * (long)*(int *)(in_RDI + 0x1f0);
              }
            }
            local_f60 = (int *)0x0;
            iVar3 = lstm(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,iVar2,
                         in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78,&local_c30,&local_c88,local_be0,
                         (Option *)CONCAT44(in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28));
            local_b60 = &local_f68;
            if (local_f60 != (int *)0x0) {
              LOCK();
              iVar1 = *local_f60;
              *local_f60 = *local_f60 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_f48 == (long *)0x0) {
                  if (local_f68 != (void *)0x0) {
                    free(local_f68);
                  }
                }
                else {
                  (**(code **)(*local_f48 + 0x18))(local_f48,local_f68);
                }
              }
            }
            local_f68 = (void *)0x0;
            local_f58 = 0;
            local_f50 = 0;
            local_f40 = 0;
            local_f3c = 0;
            local_f38 = 0;
            local_f34 = 0;
            local_f30 = 0;
            local_f28 = 0;
            local_f60 = (int *)0x0;
            local_b50 = &local_f20;
            if (local_f18 != (int *)0x0) {
              LOCK();
              iVar1 = *local_f18;
              *local_f18 = *local_f18 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_f00 == (long *)0x0) {
                  if (local_f20 != (void *)0x0) {
                    free(local_f20);
                  }
                }
                else {
                  (**(code **)(*local_f00 + 0x18))(local_f00,local_f20);
                }
              }
            }
            local_f20 = (void *)0x0;
            local_f10 = 0;
            local_f08 = 0;
            local_ef8 = 0;
            local_ef4 = 0;
            local_ef0 = 0;
            local_eec = 0;
            local_ee8 = 0;
            local_ee0 = 0;
            local_f18 = (int *)0x0;
            local_b40 = &local_ed8;
            if (local_ed0 != (int *)0x0) {
              LOCK();
              iVar1 = *local_ed0;
              *local_ed0 = *local_ed0 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_eb8 == (long *)0x0) {
                  if (local_ed8 != (void *)0x0) {
                    free(local_ed8);
                  }
                }
                else {
                  (**(code **)(*local_eb8 + 0x18))(local_eb8,local_ed8);
                }
              }
            }
            local_ed8 = (void *)0x0;
            local_ec8 = 0;
            local_ec0 = 0;
            local_eb0 = 0;
            local_eac = 0;
            local_ea8 = 0;
            local_ea4 = 0;
            local_ea0 = 0;
            local_e98 = 0;
            local_ed0 = (int *)0x0;
            local_b30 = &local_e90;
            if (local_e88 != (int *)0x0) {
              LOCK();
              iVar1 = *local_e88;
              *local_e88 = *local_e88 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_e70 == (long *)0x0) {
                  if (local_e90 != (void *)0x0) {
                    free(local_e90);
                  }
                }
                else {
                  (**(code **)(*local_e70 + 0x18))(local_e70,local_e90);
                }
              }
            }
            local_e90 = (void *)0x0;
            local_e80 = 0;
            local_e78 = 0;
            local_e68 = 0;
            local_e64 = 0;
            local_e60 = 0;
            local_e5c = 0;
            local_e58 = 0;
            local_e50 = 0;
            local_e88 = (int *)0x0;
            local_e44 = iVar3;
            if (iVar3 == 0) {
              local_7e0 = (undefined4 *)local_c30.data;
              for (local_7e4 = 0; local_7e4 < (int)local_c30.cstep * local_c30.c;
                  local_7e4 = local_7e4 + 1) {
                *local_7e0 = 0;
                local_7e0 = local_7e0 + 1;
              }
              local_800 = (undefined4 *)local_c88.data;
              for (local_804 = 0; local_804 < (int)local_c88.cstep * local_c88.c;
                  local_804 = local_804 + 1) {
                *local_800 = 0;
                local_800 = local_800 + 1;
              }
              local_f8c = *(int *)(in_RDI + 0x2c4);
              local_f88 = *(int *)(in_RDI + 0x2c8);
              local_f80 = *(undefined4 *)(in_RDI + 0x2cc);
              local_fb8 = (void *)(*(long *)(in_RDI + 0x298) +
                                  *(long *)(in_RDI + 0x2d8) * *(long *)(in_RDI + 0x2a8));
              local_fa8 = *(ulong *)(in_RDI + 0x2a8);
              local_fa0 = *(undefined4 *)(in_RDI + 0x2b0);
              local_f98 = *(long **)(in_RDI + 0x2b8);
              local_fb0 = (int *)0x0;
              local_f84 = 1;
              local_f78 = ((long)local_f8c * (long)local_f88 * local_fa8 + 0xf & 0xfffffffffffffff0)
                          / local_fa8;
              local_f90 = *(int *)(in_RDI + 0x2c0) + -1;
              if (*(int *)(in_RDI + 0x2c0) == 4) {
                local_f78 = (long)*(int *)(in_RDI + 0x2c4) * (long)*(int *)(in_RDI + 0x2c8);
              }
              local_fd4 = *(int *)(in_RDI + 0x30c);
              local_fd0 = *(int *)(in_RDI + 0x310);
              local_fc8 = *(undefined4 *)(in_RDI + 0x314);
              local_1000 = (void *)(*(long *)(in_RDI + 0x2e0) +
                                   *(long *)(in_RDI + 800) * *(long *)(in_RDI + 0x2f0));
              local_ff0 = *(ulong *)(in_RDI + 0x2f0);
              local_fe8 = *(undefined4 *)(in_RDI + 0x2f8);
              local_fe0 = *(long **)(in_RDI + 0x300);
              local_ff8 = (int *)0x0;
              local_fcc = 1;
              local_fc0 = ((long)local_fd4 * (long)local_fd0 * local_ff0 + 0xf & 0xfffffffffffffff0)
                          / local_ff0;
              local_fd8 = *(int *)(in_RDI + 0x308) + -1;
              if (*(int *)(in_RDI + 0x308) == 4) {
                local_fc0 = (long)*(int *)(in_RDI + 0x30c) * (long)*(int *)(in_RDI + 0x310);
              }
              local_101c = *(int *)(in_RDI + 0x354);
              local_1018 = *(int *)(in_RDI + 0x358);
              local_1010 = *(undefined4 *)(in_RDI + 0x35c);
              local_1048 = (void *)(*(long *)(in_RDI + 0x328) +
                                   *(long *)(in_RDI + 0x368) * *(long *)(in_RDI + 0x338));
              local_1038 = *(ulong *)(in_RDI + 0x338);
              local_1030 = *(undefined4 *)(in_RDI + 0x340);
              local_1028 = *(long **)(in_RDI + 0x348);
              local_1040 = (int *)0x0;
              local_1014 = 1;
              local_1008 = ((long)local_101c * (long)local_1018 * local_1038 + 0xf &
                           0xfffffffffffffff0) / local_1038;
              local_1020 = *(int *)(in_RDI + 0x350) + -1;
              if (*(int *)(in_RDI + 0x350) == 4) {
                local_1008 = (long)*(int *)(in_RDI + 0x354) * (long)*(int *)(in_RDI + 0x358);
              }
              if (*(int *)(in_RDI + 0xd0) == *(int *)(in_RDI + 0xdc)) {
                local_ba8 = &local_1090;
                local_1090 = (void *)0x0;
                local_1080 = 0;
                local_1078 = 0;
                local_1070 = (long *)0x0;
                local_1068 = 0;
                local_1064 = 0;
                local_1060 = 0;
                local_105c = 0;
                local_1058 = 0;
                local_1050 = 0;
              }
              else {
                local_1064 = *(int *)(in_RDI + 0x1ec);
                local_1060 = *(int *)(in_RDI + 0x1f0);
                local_1058 = *(undefined4 *)(in_RDI + 500);
                local_1090 = (void *)(*(long *)(in_RDI + 0x1c0) +
                                     *(long *)(in_RDI + 0x200) * *(long *)(in_RDI + 0x1d0));
                local_1080 = *(ulong *)(in_RDI + 0x1d0);
                local_1078 = *(undefined4 *)(in_RDI + 0x1d8);
                local_1070 = *(long **)(in_RDI + 0x1e0);
                local_105c = 1;
                local_1050 = ((long)local_1064 * (long)local_1060 * local_1080 + 0xf &
                             0xfffffffffffffff0) / local_1080;
                local_1068 = *(int *)(in_RDI + 0x1e8) + -1;
                if (*(int *)(in_RDI + 0x1e8) == 4) {
                  local_1050 = (long)*(int *)(in_RDI + 0x1ec) * (long)*(int *)(in_RDI + 0x1f0);
                }
              }
              local_1088 = (int *)0x0;
              local_e50 = 0;
              local_e68 = 0;
              iVar2 = lstm(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,iVar2,
                           in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe78,&local_c30,&local_c88,local_be0,
                           (Option *)CONCAT44(in_stack_ffffffffffffec2c,in_stack_ffffffffffffec28));
              if (local_1088 != (int *)0x0) {
                LOCK();
                iVar3 = *local_1088;
                *local_1088 = *local_1088 + -1;
                UNLOCK();
                if (iVar3 == 1) {
                  if (local_1070 == (long *)0x0) {
                    if (local_1090 != (void *)0x0) {
                      free(local_1090);
                    }
                  }
                  else {
                    (**(code **)(*local_1070 + 0x18))(local_1070,local_1090);
                  }
                }
              }
              local_1090 = (void *)0x0;
              local_1080 = 0;
              local_1078 = 0;
              local_1068 = 0;
              local_1064 = 0;
              local_1060 = 0;
              local_105c = 0;
              local_1058 = 0;
              local_1050 = 0;
              local_1088 = (int *)0x0;
              if (local_1040 != (int *)0x0) {
                LOCK();
                iVar3 = *local_1040;
                *local_1040 = *local_1040 + -1;
                UNLOCK();
                if (iVar3 == 1) {
                  if (local_1028 == (long *)0x0) {
                    if (local_1048 != (void *)0x0) {
                      free(local_1048);
                    }
                  }
                  else {
                    (**(code **)(*local_1028 + 0x18))(local_1028,local_1048);
                  }
                }
              }
              local_1048 = (void *)0x0;
              local_1038 = 0;
              local_1030 = 0;
              local_1020 = 0;
              local_101c = 0;
              local_1018 = 0;
              local_1014 = 0;
              local_1010 = 0;
              local_1008 = 0;
              local_1040 = (int *)0x0;
              if (local_ff8 != (int *)0x0) {
                LOCK();
                iVar3 = *local_ff8;
                *local_ff8 = *local_ff8 + -1;
                UNLOCK();
                if (iVar3 == 1) {
                  if (local_fe0 == (long *)0x0) {
                    if (local_1000 != (void *)0x0) {
                      free(local_1000);
                    }
                  }
                  else {
                    (**(code **)(*local_fe0 + 0x18))(local_fe0,local_1000);
                  }
                }
              }
              local_1000 = (void *)0x0;
              local_ff0 = 0;
              local_fe8 = 0;
              local_fd8 = 0;
              local_fd4 = 0;
              local_fd0 = 0;
              local_fcc = 0;
              local_fc8 = 0;
              local_fc0 = 0;
              local_ff8 = (int *)0x0;
              if (local_fb0 != (int *)0x0) {
                LOCK();
                iVar3 = *local_fb0;
                *local_fb0 = *local_fb0 + -1;
                UNLOCK();
                if (iVar3 == 1) {
                  if (local_f98 == (long *)0x0) {
                    if (local_fb8 != (void *)0x0) {
                      free(local_fb8);
                    }
                  }
                  else {
                    (**(code **)(*local_f98 + 0x18))(local_f98,local_fb8);
                  }
                }
              }
              local_fb8 = (void *)0x0;
              local_fa8 = 0;
              local_fa0 = 0;
              local_f90 = 0;
              local_f8c = 0;
              local_f88 = 0;
              local_f84 = 0;
              local_f80 = 0;
              local_f78 = 0;
              local_fb0 = (int *)0x0;
              local_f6c = iVar2;
              if (iVar2 == 0) {
                for (local_1094 = 0; local_1094 < local_be4; local_1094 = local_1094 + 1) {
                  __src = (void *)((long)local_e40 + (long)local_e14 * (long)local_1094 * local_e30)
                  ;
                  __dest = (void *)(*local_bd8 +
                                   (long)*(int *)((long)local_bd8 + 0x2c) * (long)local_1094 *
                                   local_bd8[2]);
                  memcpy(__dest,(void *)((long)local_df8 +
                                        (long)local_dcc * (long)local_1094 * local_de8),
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                  memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0xd0) * 4),__src,
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                }
                local_c40 = 0;
              }
              else {
                local_c40 = 1;
                local_bbc = iVar2;
              }
            }
            else {
              local_c40 = 1;
              local_bbc = iVar3;
            }
          }
          if (local_e38 != (int *)0x0) {
            LOCK();
            iVar2 = *local_e38;
            *local_e38 = *local_e38 + -1;
            UNLOCK();
            if (iVar2 == 1) {
              if (local_e20 == (long *)0x0) {
                if (local_e40 != (void *)0x0) {
                  free(local_e40);
                }
              }
              else {
                (**(code **)(*local_e20 + 0x18))(local_e20,local_e40);
              }
            }
          }
          local_e40 = (void *)0x0;
          local_e30 = 0;
          local_e28 = 0;
          local_e18 = 0;
          local_e14 = 0;
          local_e10 = 0;
          local_e0c = 0;
          local_e08 = 0;
          local_e00 = 0;
          local_e38 = (int *)0x0;
        }
        if (local_df0 != (int *)0x0) {
          LOCK();
          iVar2 = *local_df0;
          *local_df0 = *local_df0 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_dd8 == (long *)0x0) {
              if (local_df8 != (void *)0x0) {
                free(local_df8);
              }
            }
            else {
              (**(code **)(*local_dd8 + 0x18))(local_dd8,local_df8);
            }
          }
        }
        local_df8 = (void *)0x0;
        local_de8 = 0;
        local_de0 = 0;
        local_dd0 = 0;
        local_dcc = 0;
        local_dc8 = 0;
        local_dc4 = 0;
        local_dc0 = 0;
        local_db8 = 0;
        local_df0 = (int *)0x0;
        if (local_c40 != 0) goto LAB_010c0c3a;
      }
      local_bbc = 0;
      local_c40 = 1;
    }
  }
LAB_010c0c3a:
  if (local_c88.refcount != (int *)0x0) {
    LOCK();
    iVar2 = *local_c88.refcount;
    *local_c88.refcount = *local_c88.refcount + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_c88.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_c88.data != (undefined4 *)0x0) {
          free(local_c88.data);
        }
      }
      else {
        (*(local_c88.allocator)->_vptr_Allocator[3])(local_c88.allocator,local_c88.data);
      }
    }
  }
  local_c88.data = (void *)0x0;
  local_c88.elemsize = 0;
  local_c88.elempack = 0;
  local_c88.dims = 0;
  local_c88.w = 0;
  local_c88.h = 0;
  local_c88.d = 0;
  local_c88.c = 0;
  local_c88.cstep = 0;
  local_c88.refcount = (int *)0x0;
LAB_010c0e66:
  pMVar5 = &local_c30;
  if (local_c30.refcount != (int *)0x0) {
    LOCK();
    iVar2 = *local_c30.refcount;
    *local_c30.refcount = *local_c30.refcount + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_c30.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_c30.data != (undefined4 *)0x0) {
          free(local_c30.data);
        }
      }
      else {
        (*(local_c30.allocator)->_vptr_Allocator[3])(local_c30.allocator,local_c30.data);
      }
    }
  }
  pMVar5->data = (void *)0x0;
  pMVar5->elemsize = 0;
  pMVar5->elempack = 0;
  pMVar5->dims = 0;
  pMVar5->w = 0;
  pMVar5->h = 0;
  pMVar5->d = 0;
  pMVar5->c = 0;
  pMVar5->cstep = 0;
  pMVar5->refcount = (int *)0x0;
  return local_bbc;
}

Assistant:

int LSTM_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(hidden_size, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }

        hidden.fill(0.0f);
        cell.fill(0.0f);

        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}